

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::http_stream::handshake2<libtorrent::aux::peer_connection::start()::__0>
          (http_stream *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  undefined1 local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  pointer local_a8;
  size_t local_a0;
  int local_98;
  anon_class_8_1_8991fb9c_for_m_handler local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  error_code local_58;
  http_stream *local_48;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  unique0x100003f8 = local_b8._8_15_;
  bVar3 = proxy_base::handle_error<libtorrent::aux::peer_connection::start()::__0&>
                    (&this->super_proxy_base,e,h);
  if (!bVar3) {
    this_00 = &this->m_buffer;
    pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    if (((uVar6 < 3) || (pcVar1[uVar6 - 1] != '\n')) ||
       ((pcVar1[uVar6 - 2] != '\n' &&
        (((pcVar1[uVar6 - 2] != '\r' || uVar6 < 5 || (pcVar1[uVar6 - 3] != '\n')) ||
         (pcVar1[uVar6 - 4] != '\r')))))) {
      ::std::vector<char,_std::allocator<char>_>::resize(this_00,uVar6 + 1);
      pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_68 = 0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _local_b8 = (error_code)ZEXT816(0);
      local_78 = (h->conn).
                 super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      p_Stack_70 = (h->conn).
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      (h->conn).super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (h->conn).super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48 = this;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
      unique0x100003e0 = (error_category *)(pcVar1 + uVar6);
      local_b8 = (undefined1  [8])this;
      local_a8 = (pointer)0x1;
      local_a0 = 0;
      local_98 = 0;
      local_88 = local_78;
      _Stack_80._M_pi = p_Stack_70;
      local_58.val_ = 0;
      local_40 = 0;
      _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58.failed_ = false;
      local_58.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      local_90.this = this;
      boost::asio::detail::
      read_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/http_stream.hpp:188:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>_>
      ::operator()((read_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__http_stream_hpp:188:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>_>
                    *)local_b8,&local_58,0,1);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
    }
    else {
      auVar2[0xf] = 0;
      auVar2._0_15_ = stack0xffffffffffffff49;
      _local_b8 = (error_code)(auVar2 << 8);
      ::std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_00,local_b8);
      pcVar5 = strchr((this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start,0x20);
      if ((pcVar5 != (char *)0x0) && (iVar4 = atoi(pcVar5 + 1), iVar4 == 200)) {
        peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,e);
        _local_b8 = *(error_code *)
                     &(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data;
        local_a8 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)local_b8);
        return;
      }
      _local_b8 = boost::asio::error::make_error_code(operation_not_supported);
      peer_connection::start::anon_class_16_1_898a5c2a::operator()(h,(error_code *)local_b8);
      local_b8 = (undefined1  [8])(local_b8._5_8_ << 0x28);
      unique0x100003f0 =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      close(this,(int)local_b8);
    }
  }
  return;
}

Assistant:

void handshake2(error_code const& e, Handler h)
	{
		if (handle_error(e, h)) return;

		std::size_t const read_pos = m_buffer.size();
		// look for \n\n and \r\n\r\n
		// both of which means end of http response header
		bool found_end = false;
		if (read_pos > 2 && m_buffer[read_pos - 1] == '\n')
		{
			if (m_buffer[read_pos - 2] == '\n')
			{
				found_end = true;
			}
			else if (read_pos > 4
				&& m_buffer[read_pos - 2] == '\r'
				&& m_buffer[read_pos - 3] == '\n'
				&& m_buffer[read_pos - 4] == '\r')
			{
				found_end = true;
			}
		}

		if (found_end)
		{
			m_buffer.push_back(0);
			char const* status = std::strchr(m_buffer.data(), ' ');
			if (status == nullptr)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			status++;
			int const code = std::atoi(status);
			if (code != 200)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		// read another byte from the socket
		m_buffer.resize(read_pos + 1);
		async_read(m_sock, boost::asio::buffer(m_buffer.data() + read_pos, 1), wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				handshake2(ec, std::move(hn));
			}, std::move(h)));
	}